

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

void __thiscall zmq::session_base_t::engine_ready(session_base_t *this)

{
  pipe_t *ppVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar5;
  char *errmsg_;
  bool conflates [2];
  pipe_t *pipes [2];
  int local_c0;
  int local_bc;
  object_t *parents [2];
  endpoint_uri_pair_t local_a8;
  endpoint_uri_pair_t local_60;
  
  if (this->_pipe == (pipe_t *)0x0) {
    bVar2 = own_t::is_terminating(&this->super_own_t);
    if (!bVar2) {
      parents[1] = (object_t *)this->_socket;
      pipes[0] = (pipe_t *)0x0;
      pipes[1] = (pipe_t *)0x0;
      if ((((this->super_own_t).options.conflate == true) &&
          (uVar3 = (uint)(byte)(this->super_own_t).options.type, uVar3 < 9)) &&
         ((0x1a6U >> (uVar3 & 0x1f) & 1) != 0)) {
        local_c0 = -1;
        local_bc = -1;
        conflates[0] = true;
      }
      else {
        local_c0 = (this->super_own_t).options.rcvhwm;
        local_bc = (this->super_own_t).options.sndhwm;
        conflates[0] = false;
      }
      conflates[1] = conflates[0];
      parents[0] = (object_t *)this;
      iVar4 = pipepair(parents,pipes,&local_c0,conflates);
      if (iVar4 != 0) {
        piVar5 = __errno_location();
        errmsg_ = strerror(*piVar5);
        fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x1b2);
        fflush(_stderr);
        zmq_abort(errmsg_);
      }
      pipe_t::set_event_sink(pipes[0],&this->super_i_pipe_events);
      if (this->_pipe != (pipe_t *)0x0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_pipe",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x1b8);
        fflush(_stderr);
        zmq_abort("!_pipe");
      }
      ppVar1 = pipes[0];
      this->_pipe = pipes[0];
      iVar4 = (*this->_engine->_vptr_i_engine[8])();
      endpoint_uri_pair_t::endpoint_uri_pair_t
                (&local_60,(endpoint_uri_pair_t *)CONCAT44(extraout_var,iVar4));
      pipe_t::set_endpoint_pair(ppVar1,&local_60);
      endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_60);
      ppVar1 = pipes[1];
      iVar4 = (*this->_engine->_vptr_i_engine[8])();
      endpoint_uri_pair_t::endpoint_uri_pair_t
                (&local_a8,(endpoint_uri_pair_t *)CONCAT44(extraout_var_00,iVar4));
      pipe_t::set_endpoint_pair(ppVar1,&local_a8);
      endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_a8);
      object_t::send_bind((object_t *)this,&this->_socket->super_own_t,pipes[1],true);
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::engine_ready ()
{
    //  Create the pipe if it does not exist yet.
    if (!_pipe && !is_terminating ()) {
        object_t *parents[2] = {this, _socket};
        pipe_t *pipes[2] = {NULL, NULL};

        const bool conflate = get_effective_conflate_option (options);

        int hwms[2] = {conflate ? -1 : options.rcvhwm,
                       conflate ? -1 : options.sndhwm};
        bool conflates[2] = {conflate, conflate};
        const int rc = pipepair (parents, pipes, hwms, conflates);
        errno_assert (rc == 0);

        //  Plug the local end of the pipe.
        pipes[0]->set_event_sink (this);

        //  Remember the local end of the pipe.
        zmq_assert (!_pipe);
        _pipe = pipes[0];

        //  The endpoints strings are not set on bind, set them here so that
        //  events can use them.
        pipes[0]->set_endpoint_pair (_engine->get_endpoint ());
        pipes[1]->set_endpoint_pair (_engine->get_endpoint ());

        //  Ask socket to plug into the remote end of the pipe.
        send_bind (_socket, pipes[1]);
    }
}